

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPhase.hpp
# Opt level: O0

void __thiscall
qclab::qgates::CPhase<std::complex<float>_>::CPhase(CPhase<std::complex<float>_> *this)

{
  undefined4 local_14;
  CPhase<std::complex<float>_> *local_10;
  CPhase<std::complex<float>_> *this_local;
  
  local_10 = this;
  QControlledGate2<std::complex<float>_>::QControlledGate2
            (&this->super_QControlledGate2<std::complex<float>_>,0,1);
  (this->super_QControlledGate2<std::complex<float>_>).super_QGate2<std::complex<float>_>.
  super_QObject<std::complex<float>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_0075c558;
  local_14 = 1;
  std::make_unique<qclab::qgates::Phase<std::complex<float>>,int,double>
            ((int *)&this->gate_,(double *)&local_14);
  return;
}

Assistant:

CPhase()
        : QControlledGate2< T >( 0 )
        , gate_( std::make_unique< Phase< T > >( 1 , 0. ) )
        { }